

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nacm.c
# Opt level: O0

LY_ERR nacm_parse(lysp_ctx *pctx,lysp_ext_instance *ext)

{
  void *pvVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  ulong local_70;
  ulong local_30;
  uint64_t u;
  lysp_node *parent;
  lysp_ext_instance *ext_local;
  lysp_ctx *pctx_local;
  
  if ((ext->parent_stmt &
      (LY_STMT_USES|LY_STMT_LIST|LY_STMT_LEAF_LIST|LY_STMT_LEAF|LY_STMT_GROUPING|LY_STMT_CONTAINER|
       LY_STMT_CHOICE|LY_STMT_CASE|LY_STMT_AUGMENT|LY_STMT_ANYXML|LY_STMT_ANYDATA|LY_STMT_RPC|
       LY_STMT_ACTION|LY_STMT_OUTPUT|LY_STMT_INPUT|LY_STMT_NOTIFICATION)) == LY_STMT_NONE) {
    pcVar4 = ext->name;
    pcVar3 = lyplg_ext_stmt2str(ext->parent_stmt);
    lyplg_ext_parse_log(pctx,ext,LY_LLWRN,LY_SUCCESS,
                        "Extension %s is allowed only in a data nodes, but it is placed in \"%s\" statement."
                        ,pcVar4,pcVar3);
  }
  else {
    pvVar1 = ext->parent;
    if ((*(ushort *)((long)pvVar1 + 8) & 0x7ff) != 0) {
      pcVar4 = strchr(ext->name,0x3a);
      iVar2 = strcmp(pcVar4 + 1,"default-deny-write");
      if ((iVar2 != 0) || ((*(ushort *)((long)pvVar1 + 8) & 0x700) == 0)) {
        local_30 = 0;
        while( true ) {
          if (*(long *)((long)pvVar1 + 0x38) == 0) {
            local_70 = 0;
          }
          else {
            local_70 = *(ulong *)(*(long *)((long)pvVar1 + 0x38) + -8);
          }
          if (local_70 <= local_30) break;
          if ((((lysp_ext_instance *)(*(long *)((long)pvVar1 + 0x38) + local_30 * 0x70) != ext) &&
              (*(long *)(*(long *)((long)pvVar1 + 0x38) + local_30 * 0x70 + 0x48) != 0)) &&
             (iVar2 = strcmp(*(char **)(*(long *)(*(long *)((long)pvVar1 + 0x38) + local_30 * 0x70 +
                                                 0x48) + 0x18),(ext->record->plugin).id), iVar2 == 0
             )) {
            if (*(char **)(*(long *)((long)pvVar1 + 0x38) + local_30 * 0x70) == ext->name) {
              lyplg_ext_parse_log(pctx,ext,LY_LLERR,LY_EVALID,
                                  "Extension %s is instantiated multiple times.",ext->name);
            }
            else {
              lyplg_ext_parse_log(pctx,ext,LY_LLERR,LY_EVALID,
                                  "Extension nacm:default-deny-write is mixed with nacm:default-deny-all."
                                 );
            }
            return LY_EVALID;
          }
          local_30 = local_30 + 1;
        }
        return LY_SUCCESS;
      }
    }
    pcVar4 = ext->name;
    pcVar3 = lys_nodetype2str(*(uint16_t *)((long)pvVar1 + 8));
    lyplg_ext_parse_log(pctx,ext,LY_LLWRN,LY_SUCCESS,"Extension %s is not allowed in %s statement.",
                        pcVar4,pcVar3);
  }
  return LY_ENOT;
}

Assistant:

static LY_ERR
nacm_parse(struct lysp_ctx *pctx, struct lysp_ext_instance *ext)
{
    struct lysp_node *parent = NULL;
    LY_ARRAY_COUNT_TYPE u;

    /* check that the extension is instantiated at an allowed place - data node */
    if (!(ext->parent_stmt & LY_STMT_NODE_MASK)) {
        lyplg_ext_parse_log(pctx, ext, LY_LLWRN, 0, "Extension %s is allowed only in a data nodes, but it is placed in "
                "\"%s\" statement.", ext->name, lyplg_ext_stmt2str(ext->parent_stmt));
        return LY_ENOT;
    }

    parent = ext->parent;
    if (!(parent->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_CHOICE | LYS_ANYDATA |
            LYS_CASE | LYS_RPC | LYS_ACTION | LYS_NOTIF)) || (!strcmp(strchr(ext->name, ':') + 1, "default-deny-write") &&
            (parent->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF)))) {
        /* note LYS_AUGMENT and LYS_USES is not in the list since they are not present in the compiled tree. Instead, libyang
         * passes all their extensions to their children nodes */
        lyplg_ext_parse_log(pctx, ext, LY_LLWRN, 0, "Extension %s is not allowed in %s statement.", ext->name,
                lys_nodetype2str(parent->nodetype));
        return LY_ENOT;
    }

    /* check for duplication */
    LY_ARRAY_FOR(parent->exts, u) {
        if ((&parent->exts[u] != ext) && parent->exts[u].record && !strcmp(parent->exts[u].record->plugin.id, ext->record->plugin.id)) {
            /* duplication of a NACM extension on a single node
             * We check for all NACM plugins since we want to catch even the situation that there is default-deny-all
             * AND default-deny-write */
            if (parent->exts[u].name == ext->name) {
                lyplg_ext_parse_log(pctx, ext, LY_LLERR, LY_EVALID, "Extension %s is instantiated multiple times.", ext->name);
            } else {
                lyplg_ext_parse_log(pctx, ext, LY_LLERR, LY_EVALID,
                        "Extension nacm:default-deny-write is mixed with nacm:default-deny-all.");
            }
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}